

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

int lws_client_interpret_server_handshake(lws *wsi)

{
  allocated_headers *paVar1;
  lws_dll2 *plVar2;
  allocated_headers *paVar3;
  int iVar4;
  lws *plVar5;
  char *pcVar6;
  char *pcVar7;
  lws_filepos_t lVar8;
  size_t sVar9;
  char *local_1e8;
  lws *ww;
  lws_dll2 *d1;
  lws_dll2 *d;
  int ml;
  char *mp;
  char new_path [300];
  char *q;
  char *p;
  lws *nwsi;
  allocated_headers *ah1;
  allocated_headers *ah;
  char *cce;
  char *path;
  char *ads;
  char *prot;
  int close_reason;
  int ssl;
  int port;
  int n;
  lws *wsi_local;
  
  close_reason = 0;
  prot._4_4_ = 0;
  prot._0_4_ = LWS_CLOSE_STATUS_PROTOCOL_ERR;
  path = (char *)0x0;
  ah = (allocated_headers *)0x0;
  _port = wsi;
  plVar5 = lws_get_network_wsi(wsi);
  lws_realloc(_port->stash,0,"free");
  _port->stash = (client_info_stash *)0x0;
  paVar1 = (_port->http).ah;
  if ((*(ulong *)&_port->field_0x2dc >> 0x2d & 1) == 0) {
    if (((*(ulong *)&_port->field_0x2dc >> 0x36 & 1) == 0) &&
       ((*(ulong *)&_port->field_0x2dc >> 0x37 & 1) == 0)) {
      _lws_log(0x10,"%s: %p: transitioning to h1 client\n","lws_client_interpret_server_handshake",
               _port);
      lws_role_transition(_port,0x10000000,LRS_ESTABLISHED,&role_ops_h1);
    }
    else {
      _lws_log(0x10,"%s: %p: transitioning to h2 client\n","lws_client_interpret_server_handshake",
               _port);
      lws_role_transition(_port,0x10000000,LRS_ESTABLISHED,&role_ops_h2);
    }
    (_port->http).ah = paVar1;
    paVar1->http_response = 0;
  }
  (_port->http).conn_type = HTTP_CONNECTION_KEEP_ALIVE;
  if ((*(ulong *)&_port->field_0x2dc >> 0x37 & 1) == 0) {
    q = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP);
    if (q == (char *)0x0) {
      q = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP1_0);
      (_port->http).conn_type = HTTP_CONNECTION_CLOSE;
    }
    if (q == (char *)0x0) {
      ah = (allocated_headers *)anon_var_dwarf_7826f;
      _lws_log(8,"no URI\n");
    }
    else {
LAB_00135242:
      ssl = atoi(q);
      if (paVar1 != (allocated_headers *)0x0) {
        paVar1->http_response = ssl;
      }
      if (((*(ulong *)&_port->field_0x2dc >> 0x3a & 1) == 0) &&
         ((((ssl == 0x12d || (ssl == 0x12e)) || (ssl == 0x12f)) ||
          ((ssl == 0x133 || (ssl == 0x134)))))) {
        pcVar6 = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP_LOCATION);
        if (pcVar6 == (char *)0x0) {
          ah = (allocated_headers *)anon_var_dwarf_782b3;
        }
        else {
          if (ssl == 0x12f) {
            pcVar7 = lws_hdr_simple_ptr(_port,_WSI_TOKEN_CLIENT_METHOD);
            iVar4 = lws_hdr_total_length(_port,_WSI_TOKEN_CLIENT_METHOD);
            if ((2 < iVar4) && (pcVar7 != (char *)0x0)) {
              _lws_log(8,"%s: 303 switching to GET\n","lws_client_interpret_server_handshake");
              builtin_strncpy(pcVar7,"GET",4);
              *(ulong *)&_port->field_0x2dc =
                   *(ulong *)&_port->field_0x2dc & 0xffefffffffffffff | 0x10000000000000;
              ((_port->http).ah)->frags[((_port->http).ah)->frag_index[0x5c]].len = 3;
            }
          }
          if ((*pcVar6 == '/') || (pcVar7 = strchr(pcVar6,0x3a), pcVar7 == (char *)0x0)) {
            prot._4_4_ = (plVar5->tls).use_ssl & 1;
            path = lws_hdr_simple_ptr(_port,_WSI_TOKEN_CLIENT_PEER_ADDRESS);
            close_reason = (int)plVar5->c_port;
            if (*pcVar6 == '/') {
              pcVar6 = pcVar6 + 1;
            }
          }
          else {
            pcVar7 = strchr(pcVar6,0x3a);
            if (pcVar7 == (char *)0x0) {
              prot._4_4_ = (plVar5->tls).use_ssl & 1;
              path = lws_hdr_simple_ptr(_port,_WSI_TOKEN_CLIENT_PEER_ADDRESS);
              close_reason = (int)_port->c_port;
              cce = (char *)((long)&mp + 1);
              pcVar7 = lws_hdr_simple_ptr(_port,_WSI_TOKEN_CLIENT_URI);
              if (pcVar7 == (char *)0x0) {
                mp._0_1_ = 0x2f;
                mp._1_1_ = 0;
              }
              else {
                pcVar7 = lws_hdr_simple_ptr(_port,_WSI_TOKEN_CLIENT_URI);
                lws_strncpy((char *)&mp,pcVar7,300);
              }
              pcVar7 = strrchr((char *)&mp,0x2f);
              if (pcVar7 != (char *)0x0) {
                lws_strncpy(pcVar7 + 1,pcVar6,299 - ((long)pcVar7 - (long)&mp));
                pcVar6 = cce;
              }
            }
            else {
              iVar4 = lws_parse_uri(pcVar6,&ads,&path,&close_reason,&cce);
              if (iVar4 != 0) {
                ah = (allocated_headers *)anon_var_dwarf_782e0;
                goto LAB_00135a75;
              }
              iVar4 = strcmp(ads,"wss");
              if ((iVar4 == 0) || (iVar4 = strcmp(ads,"https"), pcVar6 = cce, iVar4 == 0)) {
                prot._4_4_ = 1;
                pcVar6 = cce;
              }
            }
          }
          cce = pcVar6;
          if ((((_port->tls).use_ssl & 1) == 0) || (prot._4_4_ != 0)) {
            if (path == (char *)0x0) {
              ah = (allocated_headers *)anon_var_dwarf_78324;
            }
            else {
              plVar5 = lws_client_reset((lws **)&port,prot._4_4_,path,close_reason,cce,path,'\x01');
              if (plVar5 != (lws *)0x0) {
                return 0;
              }
              _lws_log(1,"Redirect failed\n");
              ah = (allocated_headers *)anon_var_dwarf_78346;
              if (_port == (lws *)0x0) {
                return 1;
              }
            }
          }
          else {
            ah = (allocated_headers *)anon_var_dwarf_7830d;
          }
        }
      }
      else if ((*(ulong *)&_port->field_0x2dc >> 0x2d & 1) == 0) {
        if (((*(ulong *)&_port->field_0x2dc >> 0x36 & 1) == 0) &&
           ((*(ulong *)&_port->field_0x2dc >> 0x37 & 1) == 0)) {
          if ((_port->http).conn_type == HTTP_CONNECTION_KEEP_ALIVE) {
            *(ulong *)&_port->field_0x2dc =
                 *(ulong *)&_port->field_0x2dc & 0xfffbffffffffffff | 0x4000000000000;
          }
          else {
            *(ulong *)&_port->field_0x2dc =
                 *(ulong *)&_port->field_0x2dc & 0xfff7ffffffffffff | 0x8000000000000;
            d1 = (_port->dll2_cli_txn_queue_owner).head;
            while (d1 != (lws_dll2 *)0x0) {
              plVar2 = d1->next;
              lws_dll2_remove(d1);
              *(ulong *)((long)&d1[0xb].next + 4) =
                   *(ulong *)((long)&d1[0xb].next + 4) & 0xffdfffffffffffff;
              lws_role_transition((lws *)(d1 + -0x13),0x10000000,LRS_UNCONNECTED,&role_ops_h1);
              d1[6].owner = (lws_dll2_owner *)0x0;
              d1 = plVar2;
            }
          }
        }
        iVar4 = lws_ensure_user_space(_port);
        if (iVar4 != 0) {
          _lws_log(1,"Problem allocating wsi user mem\n");
          ah = (allocated_headers *)anon_var_dwarf_61f6f;
          goto LAB_00135a7c;
        }
        *(ulong *)&_port->field_0x2dc = *(ulong *)&_port->field_0x2dc & 0xffffbfffffffffff;
        _port->chunk_remaining = 0;
        iVar4 = lws_hdr_total_length(_port,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
        if (iVar4 != 0) {
          pcVar6 = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
          iVar4 = strcmp(pcVar6,"chunked");
          *(ulong *)&_port->field_0x2dc =
               *(ulong *)&_port->field_0x2dc & 0xffffbfffffffffff | (ulong)(iVar4 == 0) << 0x2e;
          _port->chunk_parser = '\0';
        }
        iVar4 = lws_hdr_total_length(_port,WSI_TOKEN_HTTP_CONTENT_LENGTH);
        if (iVar4 == 0) {
          if ((*(ulong *)&_port->field_0x2dc >> 0x2e & 1) == 0) {
            (_port->http).conn_type = HTTP_CONNECTION_CLOSE;
          }
        }
        else {
          pcVar6 = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP_CONTENT_LENGTH);
          lVar8 = atoll(pcVar6);
          (_port->http).rx_content_length = lVar8;
          _lws_log(8,"%s: incoming content length %llu\n","lws_client_interpret_server_handshake",
                   (_port->http).rx_content_length);
          (_port->http).rx_content_remain = (_port->http).rx_content_length;
        }
        paVar3 = (_port->http).ah;
        (_port->http).ah = paVar1;
        iVar4 = (*_port->protocol->callback)
                          (_port,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,_port->user_space,
                           (void *)0x0,0);
        if (iVar4 != 0) {
          (_port->http).ah = paVar3;
          ah = (allocated_headers *)anon_var_dwarf_7837d;
          goto LAB_00135a7c;
        }
        lws_set_timeout(_port,NO_PENDING_TIMEOUT,0);
        *(ulong *)&_port->field_0x2dc = *(ulong *)&_port->field_0x2dc & 0xffffffffffff9fff | 0x2000;
        iVar4 = (*_port->protocol->callback)
                          (_port,LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,_port->user_space,(void *)0x0,
                           0);
        if (iVar4 == 0) {
          (_port->http).ah = paVar3;
          _lws_log(8,"%s: client connection up\n","lws_client_interpret_server_handshake");
          iVar4 = lws_hdr_total_length(_port,WSI_TOKEN_HTTP_CONTENT_LENGTH);
          if ((iVar4 != 0) && ((_port->http).rx_content_length == 0)) {
            iVar4 = lws_http_transaction_completed_client(_port);
            return (uint)(iVar4 != 0);
          }
          return 0;
        }
        (_port->http).ah = paVar3;
        ah = (allocated_headers *)anon_var_dwarf_78388;
      }
      else {
        iVar4 = lws_client_ws_upgrade(_port,(char **)&ah);
        if (iVar4 == 2) goto LAB_00135a7c;
        if (iVar4 != 3) {
          return 0;
        }
      }
    }
  }
  else {
    q = lws_hdr_simple_ptr(_port,WSI_TOKEN_HTTP_COLON_STATUS);
    if (q != (char *)0x0) goto LAB_00135242;
    ah = (allocated_headers *)anon_var_dwarf_78285;
    _lws_log(8,"no status\n");
  }
LAB_00135a75:
  prot._0_4_ = LWS_CLOSE_STATUS_NOSTATUS;
LAB_00135a7c:
  if (_port->protocol != (lws_protocols *)0x0) {
    ssl = 0;
    if (ah != (allocated_headers *)0x0) {
      sVar9 = strlen((char *)ah);
      ssl = (int)sVar9;
    }
    lws_inform_client_conn_fail(_port,ah,(ulong)(uint)ssl);
  }
  if (_port->protocol == (lws_protocols *)0x0) {
    local_1e8 = "unknown";
  }
  else {
    local_1e8 = _port->protocol->name;
  }
  _lws_log(8,"closing connection (prot %s) due to bail2 connection error: %s\n",local_1e8,ah);
  lws_close_free_wsi(_port,(lws_close_status)prot,"c hs interp");
  return 1;
}

Assistant:

int
lws_client_interpret_server_handshake(struct lws *wsi)
{
	int n, port = 0, ssl = 0;
	int close_reason = LWS_CLOSE_STATUS_PROTOCOL_ERR;
	const char *prot, *ads = NULL, *path, *cce = NULL;
	struct allocated_headers *ah, *ah1;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	char *p, *q;
	char new_path[300];

	lws_free_set_NULL(wsi->stash);

	ah = wsi->http.ah;
	if (!wsi->do_ws) {
		/* we are being an http client...
		 */
#if defined(LWS_ROLE_H2)
		if (wsi->client_h2_alpn || wsi->client_mux_substream) {
			lwsl_debug("%s: %p: transitioning to h2 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h2);
		} else
#endif
		{
#if defined(LWS_ROLE_H1)
			{
			lwsl_debug("%s: %p: transitioning to h1 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h1);
			}
#else
			return -1;
#endif
		}

		wsi->http.ah = ah;
		ah->http_response = 0;
	}

	/*
	 * well, what the server sent looked reasonable for syntax.
	 * Now let's confirm it sent all the necessary headers
	 *
	 * http (non-ws) client will expect something like this
	 *
	 * HTTP/1.0.200
	 * server:.libwebsockets
	 * content-type:.text/html
	 * content-length:.17703
	 * set-cookie:.test=LWS_1456736240_336776_COOKIE;Max-Age=360000
	 */

	wsi->http.conn_type = HTTP_CONNECTION_KEEP_ALIVE;
	if (!wsi->client_mux_substream) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP);
		/*
		if (wsi->do_ws && !p) {
			lwsl_info("no URI\n");
			cce = "HS: URI missing";
			goto bail3;
		}
		*/
		if (!p) {
			p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP1_0);
			wsi->http.conn_type = HTTP_CONNECTION_CLOSE;
		}
		if (!p) {
			cce = "HS: URI missing";
			lwsl_info("no URI\n");
			goto bail3;
		}
	} else {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_STATUS);
		if (!p) {
			cce = "HS: :status missing";
			lwsl_info("no status\n");
			goto bail3;
		}
	}
	n = atoi(p);
	if (ah)
		ah->http_response = n;

	if (!wsi->client_no_follow_redirect &&
#if defined(LWS_WITH_HTTP_PROXY)
	    !wsi->http.proxy_clientside &&
#endif
	    (n == 301 || n == 302 || n == 303 || n == 307 || n == 308)) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_LOCATION);
		if (!p) {
			cce = "HS: Redirect code but no Location";
			goto bail3;
		}

		/*
		 * Some redirect codes imply we have to change the method
		 * used for the subsequent transaction, commonly POST ->
		 * 303 -> GET.
		 */

		if (n == 303) {
			char *mp = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
			int ml = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_METHOD);

			if (ml >= 3 && mp) {
				lwsl_info("%s: 303 switching to GET\n", __func__);
				memcpy(mp, "GET", 4);
				wsi->redirected_to_get = 1;
				wsi->http.ah->frags[wsi->http.ah->frag_index[
				             _WSI_TOKEN_CLIENT_METHOD]].len = 3;
			}
		}

		/* Relative reference absolute path */
		if (p[0] == '/' || !strchr(p, ':')) {
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = nwsi->c_port;
			path = p;
			/* lws_client_reset expects leading / omitted */
			if (*path == '/')
				path++;
		}
		/* Absolute (Full) URI */
		else if (strchr(p, ':')) {
			if (lws_parse_uri(p, &prot, &ads, &port, &path)) {
				cce = "HS: URI did not parse";
				goto bail3;
			}

			if (!strcmp(prot, "wss") || !strcmp(prot, "https"))
				ssl = LCCSCF_USE_SSL;
		}
		/* Relative reference relative path */
		else {
			/* This doesn't try to calculate an absolute path,
			 * that will be left to the server */
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = wsi->c_port;
			/* +1 as lws_client_reset expects leading / omitted */
			path = new_path + 1;
			if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI))
				lws_strncpy(new_path, lws_hdr_simple_ptr(wsi,
				   _WSI_TOKEN_CLIENT_URI), sizeof(new_path));
			else {
				new_path[0] = '/';
				new_path[1] = '\0';
			}
			q = strrchr(new_path, '/');
			if (q)
				lws_strncpy(q + 1, p, sizeof(new_path) -
							(q - new_path) - 1);
			else
				path = p;
		}

#if defined(LWS_WITH_TLS)
		if ((wsi->tls.use_ssl & LCCSCF_USE_SSL) && !ssl) {
			cce = "HS: Redirect attempted SSL downgrade";
			goto bail3;
		}
#endif

		if (!ads) /* make coverity happy */ {
			cce = "no ads";
			goto bail3;
		}

		if (!lws_client_reset(&wsi, ssl, ads, port, path, ads, 1)) {
			/*
			 * There are two ways to fail out with NULL return...
			 * simple, early problem where the wsi is intact, or
			 * we went through with the reconnect attempt and the
			 * wsi is already closed.  In the latter case, the wsi
			 * has been set to NULL additionally.
			 */
			lwsl_err("Redirect failed\n");
			cce = "HS: Redirect failed";
			/* coverity[reverse_inull] */
			if (wsi)
				goto bail3;

			/* wsi has closed */
			return 1;
		}
		return 0;
	}

	if (!wsi->do_ws) {

		/* if h1 KA is allowed, enable the queued pipeline guys */

		if (!wsi->client_h2_alpn && !wsi->client_mux_substream) {
			/* ie, coming to this for the first time */
			if (wsi->http.conn_type == HTTP_CONNECTION_KEEP_ALIVE)
				wsi->keepalive_active = 1;
			else {
				/*
				 * Ugh... now the main http connection has seen
				 * both sides, we learn the server doesn't
				 * support keepalive.
				 *
				 * That means any guys queued on us are going
				 * to have to be restarted from connect2 with
				 * their own connections.
				 */

				/*
				 * stick around telling any new guys they can't
				 * pipeline to this server
				 */
				wsi->keepalive_rejected = 1;

				lws_vhost_lock(wsi->vhost);
				lws_start_foreach_dll_safe(struct lws_dll2 *,
							   d, d1,
				  wsi->dll2_cli_txn_queue_owner.head) {
					struct lws *ww = lws_container_of(d,
						struct lws,
						dll2_cli_txn_queue);

					/* remove him from our queue */
					lws_dll2_remove(&ww->dll2_cli_txn_queue);
					/* give up on pipelining */
					ww->client_pipeline = 0;

					/* go back to "trying to connect" state */
					lws_role_transition(ww, LWSIFR_CLIENT,
							    LRS_UNCONNECTED,
#if defined(LWS_ROLE_H1)
							    &role_ops_h1);
#else
#if defined (LWS_ROLE_H2)
							    &role_ops_h2);
#else
							    &role_ops_raw);
#endif
#endif
					ww->user_space = NULL;
				} lws_end_foreach_dll_safe(d, d1);
				lws_vhost_unlock(wsi->vhost);
			}
		}

#ifdef LWS_WITH_HTTP_PROXY
		wsi->http.perform_rewrite = 0;
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE)) {
			if (!strncmp(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_TYPE),
						"text/html", 9))
				wsi->http.perform_rewrite = 0;
		}
#endif

		/* allocate the per-connection user memory (if any) */
		if (lws_ensure_user_space(wsi)) {
			lwsl_err("Problem allocating wsi user mem\n");
			cce = "HS: OOM";
			goto bail2;
		}

		/* he may choose to send us stuff in chunked transfer-coding */
		wsi->chunked = 0;
		wsi->chunk_remaining = 0; /* ie, next thing is chunk size */
		if (lws_hdr_total_length(wsi,
					WSI_TOKEN_HTTP_TRANSFER_ENCODING)) {
			wsi->chunked = !strcmp(lws_hdr_simple_ptr(wsi,
					       WSI_TOKEN_HTTP_TRANSFER_ENCODING),
						"chunked");
			/* first thing is hex, after payload there is crlf */
			wsi->chunk_parser = ELCP_HEX;
		}

		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			wsi->http.rx_content_length =
					atoll(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_LENGTH));
			lwsl_info("%s: incoming content length %llu\n",
				    __func__, (unsigned long long)
					    wsi->http.rx_content_length);
			wsi->http.rx_content_remain =
					wsi->http.rx_content_length;
		} else /* can't do 1.1 without a content length or chunked */
			if (!wsi->chunked)
				wsi->http.conn_type = HTTP_CONNECTION_CLOSE;

		/*
		 * we seem to be good to go, give client last chance to check
		 * headers and OK it
		 */
		ah1 = wsi->http.ah;
		wsi->http.ah = ah;
		if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed by client filter";
			goto bail2;
		}

		/* clear his proxy connection timeout */
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

		/* call him back to inform him he is up */
		if (wsi->protocol->callback(wsi,
					    LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed at ESTABLISHED";
			goto bail3;
		}

		wsi->http.ah = ah1;

		lwsl_info("%s: client connection up\n", __func__);

		/*
		 * Did we get a response from the server with an explicit
		 * content-length of zero?  If so, this transaction is already
		 * completed at the end of the header processing...
		 */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    !wsi->http.rx_content_length)
		        return !!lws_http_transaction_completed_client(wsi);

		return 0;
	}

#if defined(LWS_ROLE_WS)
	switch (lws_client_ws_upgrade(wsi, &cce)) {
	case 2:
		goto bail2;
	case 3:
		goto bail3;
	}

	return 0;
#endif

bail3:
	close_reason = LWS_CLOSE_STATUS_NOSTATUS;

bail2:
	if (wsi->protocol) {
		n = 0;
		if (cce)
			n = (int)strlen(cce);

		lws_inform_client_conn_fail(wsi, (void *)cce, (unsigned int)n);
	}

	lwsl_info("closing connection (prot %s) "
		  "due to bail2 connection error: %s\n", wsi->protocol ?
				  wsi->protocol->name : "unknown", cce);

	/* closing will free up his parsing allocations */
	lws_close_free_wsi(wsi, close_reason, "c hs interp");

	return 1;
}